

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O3

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findAllIntersections
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  Node *pNVar7;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *pvVar8;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *pvVar9;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX_00;
  long lVar10;
  Node **value;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *pvVar11;
  Node *node_00;
  float fVar12;
  float fVar13;
  
  pvVar8 = *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> **)
            &this[1].mBox;
  pvVar9 = *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> **)
            &this[1].mBox.width;
  if (pvVar9 != pvVar8) {
    pvVar11 = (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)0x0;
    do {
      if (pvVar11 !=
          (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)0x0) {
        lVar10 = 0;
        pvVar9 = pvVar11;
        do {
          lVar5 = *(long *)&this[1].mBox;
          puVar6 = *(undefined8 **)(lVar5 + (long)pvVar11 * 8);
          uVar1 = *puVar6;
          uVar2 = **(undefined8 **)(lVar5 + lVar10);
          uVar3 = (*(undefined8 **)(lVar5 + lVar10))[1];
          fVar13 = (float)uVar2;
          fVar12 = (float)uVar1;
          if ((fVar12 < fVar13 + (float)uVar3) &&
             (uVar4 = puVar6[1], fVar13 < fVar12 + (float)uVar4)) {
            fVar12 = (float)((ulong)uVar2 >> 0x20);
            fVar13 = (float)((ulong)uVar1 >> 0x20);
            if ((fVar13 < (float)((ulong)uVar3 >> 0x20) + fVar12) &&
               (fVar12 < fVar13 + (float)((ulong)uVar4 >> 0x20))) {
              std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
              emplace_back<Node*&,Node*&>
                        ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
                         node,(Node **)(lVar5 + (long)pvVar11 * 8),(Node **)(lVar5 + lVar10));
            }
          }
          lVar10 = lVar10 + 8;
          pvVar9 = (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *
                   )((long)&pvVar9[-1].
                            super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        } while (pvVar9 != (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                            *)0x0);
        pvVar8 = *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> **
                  )&this[1].mBox;
        pvVar9 = *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> **
                  )&this[1].mBox.width;
      }
      pvVar11 = (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
                ((long)&(pvVar11->
                        super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
      intersections =
           (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
           ((long)pvVar9 - (long)pvVar8 >> 3);
    } while (pvVar11 < intersections);
  }
  lVar10._0_4_ = (this->mBox).left;
  lVar10._4_4_ = (this->mBox).top;
  if (lVar10 != 0) {
    lVar10 = 0;
    do {
      pNVar7 = *(Node **)&this[1].mBox.width;
      for (node_00 = *(Node **)&this[1].mBox; node_00 != pNVar7;
          node_00 = (Node *)((node_00->children)._M_elems + 1)) {
        findIntersectionsInDescendants
                  (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                     **)((long)&(this->mBox).left + lVar10),node_00,(Node **)node,pvVar9);
        intersections = extraout_RDX;
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x20);
    lVar10 = 0;
    do {
      findAllIntersections
                (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                   **)((long)&(this->mBox).left + lVar10),node,intersections);
      lVar10 = lVar10 + 8;
      intersections = extraout_RDX_00;
    } while (lVar10 != 0x20);
  }
  return;
}

Assistant:

void findAllIntersections(Node* node, std::vector<std::pair<T, T>>& intersections) const
    {
        // Find intersections between values stored in this node
        // Make sure to not report the same intersection twice
        for (auto i = std::size_t(0); i < node->values.size(); ++i)
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (mGetBox(node->values[i]).intersects(mGetBox(node->values[j])))
                    intersections.emplace_back(node->values[i], node->values[j]);
            }
        }
        if (!isLeaf(node))
        {
            // Values in this node can intersect values in descendants
            for (const auto& child : node->children)
            {
                for (const auto& value : node->values)
                    findIntersectionsInDescendants(child.get(), value, intersections);
            }
            // Find intersections in children
            for (const auto& child : node->children)
                findAllIntersections(child.get(), intersections);
        }
    }